

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O3

uint64_t pull_varint(uchar **cursor,size_t *max)

{
  ulong __n;
  size_t sVar1;
  uchar *puVar2;
  ulong __n_00;
  uchar buf [9];
  uint64_t v;
  uchar local_49;
  undefined1 local_48 [8];
  uchar **local_40;
  uint64_t local_38;
  
  if (*max == 0) {
    local_49 = '\0';
    puVar2 = (uchar *)0x0;
    sVar1 = 0;
  }
  else {
    local_49 = **cursor;
    puVar2 = *cursor + 1;
    sVar1 = *max - 1;
  }
  *cursor = puVar2;
  *max = sVar1;
  sVar1 = varint_length_from_bytes(&local_49);
  __n_00 = sVar1 - 1;
  __n = *max;
  puVar2 = *cursor;
  sVar1 = __n - __n_00;
  local_40 = cursor;
  if (__n < __n_00) {
    memcpy(local_48,puVar2,__n);
    puVar2 = (uchar *)0x0;
    memset(local_48 + __n,0,__n_00 - __n);
    sVar1 = 0;
  }
  else {
    memcpy(local_48,puVar2,__n_00);
    puVar2 = puVar2 + __n_00;
  }
  *local_40 = puVar2;
  *max = sVar1;
  varint_from_bytes(&local_49,&local_38);
  return local_38;
}

Assistant:

uint64_t pull_varint(const unsigned char **cursor, size_t *max)
{
    unsigned char buf[sizeof(uint8_t) + sizeof(uint64_t)];
    uint64_t v;

    /* FIXME: Would be more efficient to opencode varint here! */
    pull_bytes(buf, 1, cursor, max);
    pull_bytes(buf + 1, varint_length_from_bytes(buf) - 1, cursor, max);
    varint_from_bytes(buf, &v);

    return v;
}